

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O3

int xml_parse_data(ly_ctx *ctx,lyxml_elem *xml,lyd_node *parent,lyd_node *first_sibling,
                  lyd_node *prev,int options,unres_data *unres,lyd_node **result,
                  lyd_node **act_notif,char *yang_data_name)

{
  uint8_t *puVar1;
  ushort uVar2;
  undefined2 uVar3;
  LYS_NODE LVar4;
  byte *__s;
  lyd_attr *plVar5;
  lyd_node *plVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  lys_node_leaf *plVar11;
  lys_module *plVar12;
  lys_node *plVar13;
  undefined8 *puVar14;
  lyd_node *plVar15;
  lys_node_list *plVar16;
  size_t sVar17;
  char *pcVar18;
  lyd_attr *plVar19;
  hash_table *phVar20;
  lyd_node *plVar21;
  lyxml_elem *plVar22;
  byte *pbVar23;
  LY_VLOG_ELEM LVar24;
  ulong uVar25;
  lyd_node **first_sibling_00;
  lyd_node *plVar26;
  lyxml_attr *plVar27;
  lyxml_elem *plVar28;
  LY_ECODE LVar29;
  ly_ctx *plVar30;
  void *pvVar31;
  char *pcVar32;
  undefined4 in_register_0000008c;
  undefined8 uVar33;
  lys_node *parent_00;
  bool bVar34;
  lyd_node *local_88;
  lyd_node *first_sibling_local;
  int local_74;
  lyd_attr *plStack_70;
  int editbits;
  lyd_attr *dattr;
  lys_node_list *local_60;
  char *local_58;
  lys_node_leaf *local_50;
  ulong local_48;
  byte local_39;
  ly_ctx *plStack_38;
  uint8_t pos;
  
  local_74 = 0;
  local_88 = first_sibling;
  if (xml == (lyxml_elem *)0x0) {
    __assert_fail("xml",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                  ,0x7a,
                  "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                 );
  }
  if (result == (lyd_node **)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                  ,0x7b,
                  "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                 );
  }
  *result = (lyd_node *)0x0;
  if ((xml->flags & 1U) != 0) {
    if (((uint)options >> 9 & 1) == 0) {
      return 0;
    }
    pcVar18 = "XML element with mixed content";
    LVar29 = LYE_XML_INVAL;
    LVar24 = LY_VLOG_XML;
    goto LAB_0013f67c;
  }
  if ((xml->ns == (lyxml_ns *)0x0) || (pcVar18 = xml->ns->value, pcVar18 == (char *)0x0)) {
    if (((uint)options >> 9 & 1) != 0) {
      ly_vlog(ctx,LYE_XML_MISS,LY_VLOG_XML,xml,"element\'s","namespace");
      return -1;
    }
    return 0;
  }
  dattr = (lyd_attr *)prev;
  local_48 = CONCAT44(in_register_0000008c,options);
  plStack_38 = ctx;
  if (parent != (lyd_node *)0x0) {
    plVar21 = first_sibling;
    plVar11 = (lys_node_leaf *)xml_data_search_schemanode(xml,parent->schema->child,options);
    if (ctx->data_clb != (ly_module_data_clb)0x0) {
      if (plVar11 == (lys_node_leaf *)0x0) {
        plVar11 = (lys_node_leaf *)0x0;
        plVar21 = (lyd_node *)0x0;
        plVar12 = (*ctx->data_clb)(ctx,(char *)0x0,xml->ns->value,0,ctx->data_clb_data);
        if (plVar12 == (lys_module *)0x0) goto LAB_0013f5e5;
        plVar13 = parent->schema->child;
LAB_0013f5d2:
        plVar11 = (lys_node_leaf *)xml_data_search_schemanode(xml,plVar13,(int)local_48);
      }
      else {
        plVar12 = lys_node_module((lys_node *)plVar11);
        if ((plVar12->field_0x40 & 0x80) == 0) {
          local_50 = (lys_node_leaf *)ctx->data_clb;
          plVar12 = lys_node_module((lys_node *)plVar11);
          local_58 = plVar12->name;
          plVar12 = lys_node_module((lys_node *)plVar11);
          plVar21 = (lyd_node *)0x0;
          (*(code *)local_50)(ctx,local_58,plVar12->ns,1);
        }
      }
    }
    goto LAB_0013f5e5;
  }
  plVar21 = (lyd_node *)0x0;
  plVar12 = ly_ctx_get_module_by_ns(ctx,pcVar18,(char *)0x0,0);
  if (ctx->data_clb == (ly_module_data_clb)0x0) {
LAB_0013f4c0:
    if (plVar12 != (lys_module *)0x0) {
      uVar2 = *(ushort *)&plVar12->field_0x40;
      goto LAB_0013f4cd;
    }
LAB_0013f5e3:
    plVar11 = (lys_node_leaf *)0x0;
  }
  else {
    if (plVar12 == (lys_module *)0x0) {
      pcVar32 = xml->ns->value;
      pvVar31 = ctx->data_clb_data;
      pcVar18 = (char *)0x0;
      plVar21 = (lyd_node *)0x0;
LAB_0013f4bb:
      plVar12 = (*ctx->data_clb)(ctx,pcVar18,pcVar32,(int)plVar21,pvVar31);
      goto LAB_0013f4c0;
    }
    uVar2 = *(ushort *)&plVar12->field_0x40;
    if (-1 < (char)uVar2) {
      pcVar18 = plVar12->name;
      pcVar32 = plVar12->ns;
      pvVar31 = ctx->data_clb_data;
      plVar21 = (lyd_node *)0x1;
      goto LAB_0013f4bb;
    }
LAB_0013f4cd:
    plVar21 = (lyd_node *)0x0;
    if ((uVar2 & 0xc0) != 0x80) goto LAB_0013f5e3;
    if (((uint)local_48 >> 0x18 & 1) != 0) {
      if (yang_data_name != (char *)0x0) {
        sVar17 = strlen(yang_data_name);
        plVar13 = lyp_get_yang_data_template(plVar12,yang_data_name,(int)sVar17);
        if (plVar13 != (lys_node *)0x0) {
          puVar14 = (undefined8 *)
                    lys_ext_complex_get_substmt
                              (LY_STMT_CONTAINER,(lys_ext_instance_complex *)plVar13,
                               (lyext_substmt **)0x0);
          plVar13 = (lys_node *)*puVar14;
          goto LAB_0013f5d2;
        }
      }
      goto LAB_0013f5e3;
    }
    local_50 = (lys_node_leaf *)plVar12;
    plVar11 = (lys_node_leaf *)xml_data_search_schemanode(xml,plVar12->data,(uint)local_48);
    if (plVar11 == (lys_node_leaf *)0x0) {
      if (*(uint8_t *)((long)local_50 + 0x4d) == '\0') goto LAB_0013f5e3;
      local_58 = (char *)0x0;
      do {
        plVar21 = (lyd_node *)((long)local_58 * 0x68);
        plVar13 = (*(lys_node_augment **)((long)local_50 + 0x88))[(long)local_58].target;
        if ((plVar13->nodetype & (LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN) {
          parent_00 = (lys_node *)(*(lys_node_augment **)((long)local_50 + 0x88) + (long)local_58);
          do {
            uVar3 = (undefined2)plVar13->nodetype;
            plVar21 = (lyd_node *)(ulong)(ushort)uVar3;
            if ((uVar3 & (LYS_USES|LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN) goto LAB_0013f57e;
            plVar13 = lys_parent(plVar13);
          } while (plVar13 != (lys_node *)0x0);
          plVar11 = (lys_node_leaf *)0x0;
          while( true ) {
            plVar21 = (lyd_node *)0x0;
            plVar11 = (lys_node_leaf *)
                      lys_getnext((lys_node *)plVar11,parent_00,(lys_module *)0x0,0);
            if (plVar11 == (lys_node_leaf *)0x0) break;
            if (plVar11->name == xml->name) goto LAB_0013f5e5;
          }
        }
LAB_0013f57e:
        local_58 = local_58 + 1;
        plVar11 = (lys_node_leaf *)0x0;
      } while (local_58 < (char *)(ulong)*(uint8_t *)((long)local_50 + 0x4d));
    }
  }
LAB_0013f5e5:
  plVar12 = lys_node_module((lys_node *)plVar11);
  plVar26 = (lyd_node *)dattr;
  if ((plVar12 == (lys_module *)0x0) || ((*(ushort *)&plVar12->field_0x40 & 0xc0) != 0x80)) {
    if (((uint)local_48 >> 9 & 1) == 0) {
      return 0;
    }
    plVar22 = (lyxml_elem *)0x1bdddd;
    if (parent != (lyd_node *)0x0) {
      plVar22 = (lyxml_elem *)parent;
    }
    LVar24 = (parent == (lyd_node *)0x0) + LY_VLOG_LYD;
    pcVar18 = xml->name;
    LVar29 = LYE_INELEM;
    xml = plVar22;
    ctx = plStack_38;
LAB_0013f67c:
    ly_vlog(ctx,LVar29,LVar24,xml,pcVar18);
    return -1;
  }
  LVar4 = plVar11->nodetype;
  local_50 = plVar11;
  if ((int)LVar4 < 0x20) {
    if ((int)LVar4 < 8) {
      if (LVar4 != LYS_CONTAINER) {
        if (LVar4 != LYS_LEAF) {
LAB_0013f728:
          ly_log(plStack_38,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                 ,0xfe);
          return -1;
        }
LAB_0013f753:
        sVar17 = 0x50;
        goto LAB_0013f769;
      }
    }
    else {
      if (LVar4 == LYS_LEAFLIST) goto LAB_0013f753;
      if (LVar4 != LYS_LIST) goto LAB_0013f728;
    }
LAB_0013f6c5:
    __s = (byte *)xml->content;
    pbVar23 = __s;
    if (__s != (byte *)0x0) {
      for (; uVar25 = (ulong)*pbVar23, uVar25 < 0x21; pbVar23 = pbVar23 + 1) {
        if ((0x100002600U >> (uVar25 & 0x3f) & 1) == 0) {
          if (uVar25 == 0) goto LAB_0013f6fd;
          break;
        }
      }
      sVar17 = strlen((char *)__s);
      pcVar18 = (char *)malloc(sVar17 + 0x17);
      if (pcVar18 != (char *)0x0) {
        sprintf(pcVar18,"node with text data \"%s\"",__s);
        ly_vlog(plStack_38,LYE_XML_INVAL,LY_VLOG_XML,xml,pcVar18);
        free(pcVar18);
        return -1;
      }
      goto LAB_0013f8a7;
    }
LAB_0013f6fd:
    plVar15 = (lyd_node *)calloc(1,0x48);
    local_58 = (char *)((ulong)local_58 & 0xffffffff00000000);
    plVar26 = (lyd_node *)dattr;
  }
  else {
    if (0xff < (int)LVar4) {
      if (LVar4 != LYS_RPC) {
        if (LVar4 == LYS_ANYDATA) goto LAB_0013f75f;
        if (LVar4 != LYS_ACTION) goto LAB_0013f728;
      }
      goto LAB_0013f6c5;
    }
    if (LVar4 != LYS_ANYXML) {
      if (LVar4 != LYS_NOTIF) goto LAB_0013f728;
      goto LAB_0013f6c5;
    }
LAB_0013f75f:
    sVar17 = 0x40;
LAB_0013f769:
    plVar15 = (lyd_node *)calloc(1,sVar17);
    local_58 = (char *)CONCAT44(local_58._4_4_,(int)CONCAT71((int7)((ulong)plVar21 >> 8),1));
  }
  *result = plVar15;
  if (plVar15 == (lyd_node *)0x0) {
LAB_0013f8a7:
    ly_log(plStack_38,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xml_parse_data");
    return -1;
  }
  plVar15->prev = plVar15;
  plVar15->schema = (lys_node *)local_50;
  plVar15->parent = parent;
  first_sibling_local = (lyd_node *)0x0;
  if ((LVar4 == LYS_LEAF) &&
     (local_60 = lys_is_key(local_50,&local_39), local_60 != (lys_node_list *)0x0)) {
    if (parent == (lyd_node *)0x0) {
      __assert_fail("parent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                    ,0x109,
                    "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                   );
    }
    plVar21 = parent->child;
    first_sibling_local = plVar21;
    if ((plVar21 != (lyd_node *)0x0) && (local_39 != 0)) {
      uVar10 = 1;
      do {
        first_sibling_local = plVar21;
        if ((((lys_node_leaf *)plVar21->schema)->nodetype != LYS_LEAF) ||
           (plVar16 = lys_is_key((lys_node_leaf *)plVar21->schema,(uint8_t *)0x0),
           plVar16 == (lys_node_list *)0x0)) goto LAB_0013fcee;
        plVar21 = plVar21->next;
        first_sibling_local = plVar21;
      } while ((plVar21 != (lyd_node *)0x0) &&
              (bVar34 = uVar10 < local_39, uVar10 = uVar10 + 1, bVar34));
    }
    plVar26 = (lyd_node *)dattr;
    plVar21 = first_sibling_local;
    if (first_sibling_local == (lyd_node *)0x0) goto LAB_0013f81b;
LAB_0013fcee:
    plVar30 = plStack_38;
    plVar11 = local_50;
    plVar26 = (lyd_node *)dattr;
    if (((uint)local_48 >> 9 & 1) != 0) {
      ly_vlog(plStack_38,LYE_INORDER,LY_VLOG_LYD,*result,local_50->name,plVar21->schema->name);
      ly_vlog(plVar30,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
              "Invalid position of the key \"%s\" in a list \"%s\".",plVar11->name,
              parent->schema->name);
      free(*result);
      *result = (lyd_node *)0x0;
      return -1;
    }
    ly_log(plStack_38,LY_LLWRN,LY_SUCCESS,"Invalid position of the key \"%s\" in a list \"%s\".",
           local_50->name,parent->schema->name);
    plVar15 = *result;
    if (parent->child == plVar21) {
      parent->child = plVar15;
      first_sibling = plVar15;
      local_88 = plVar15;
    }
    plVar6 = plVar21->prev;
    if (plVar6->next != (lyd_node *)0x0) {
      plVar6->next = plVar15;
    }
    plVar15->prev = plVar6;
    plVar15 = *result;
    plVar21->prev = plVar15;
    plVar15->next = plVar21;
    if (local_60 == (lys_node_list *)0x0) goto LAB_0013f824;
  }
  else {
LAB_0013f81b:
    if (parent != (lyd_node *)0x0) {
LAB_0013f824:
      if (parent->child == (lyd_node *)0x0) {
        parent->child = *result;
      }
    }
    plVar21 = *result;
    if (plVar26 == (lyd_node *)0x0) {
      plVar21->prev = plVar21;
      local_88 = plVar21;
    }
    else {
      plVar21->prev = plVar26;
      plVar21 = *result;
      plVar26->next = plVar21;
      first_sibling->prev = plVar21;
    }
  }
  iVar9 = ly_new_node_validity((*result)->schema);
  (*result)->validity = (uint8_t)iVar9;
  iVar9 = resolve_applies_when((lys_node *)local_50,0,(lys_node *)0x0);
  if (iVar9 != 0) {
    (*result)->field_0x9 = (*result)->field_0x9 & 0xf1 | 8;
  }
  plVar27 = xml->attr;
  if (plVar27 == (lyxml_attr *)0x0) {
    if ((local_48 & 8) == 0) goto switchD_0013fbe8_caseD_1;
LAB_0013fc01:
    iVar9 = lyp_check_edit_attr(plStack_38,(*result)->attr,*result,&local_74);
    if (iVar9 == 0) {
switchD_0013fbe8_caseD_1:
      plVar30 = plStack_38;
      plVar11 = local_50;
      LVar4 = local_50->nodetype;
      if ((LVar4 & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        if ((LVar4 & LYS_ANYDATA) == LYS_UNKNOWN) {
          if ((LVar4 & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) {
            if ((local_48 & 0x10) == 0) {
              plVar21 = *result;
            }
            else {
              plVar21 = *result;
              if (*act_notif == (lyd_node *)0x0) {
LAB_0013ff75:
                *act_notif = plVar21;
                goto LAB_0013ff78;
              }
            }
            ly_vlog(plStack_38,LYE_INELEM,LY_VLOG_LYD,plVar21,local_50->name);
            pcVar18 = "action";
            if (plVar11->nodetype == LYS_RPC) {
              pcVar18 = "rpc";
            }
            ly_vlog(plVar30,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,"Unexpected %s node \"%s\".",pcVar18,
                    plVar11->name);
            goto LAB_001400f3;
          }
          if (LVar4 == LYS_NOTIF) {
            if ((local_48 & 0x40) == 0) {
              plVar21 = *result;
            }
            else {
              plVar21 = *result;
              if (*act_notif == (lyd_node *)0x0) goto LAB_0013ff75;
            }
            ly_vlog(plStack_38,LYE_INELEM,LY_VLOG_LYD,plVar21,local_50->name);
            pcVar18 = plVar11->name;
            pcVar32 = "Unexpected notification node \"%s\".";
            LVar29 = LYE_SPEC;
            LVar24 = LY_VLOG_PREV;
            plVar16 = (lys_node_list *)0x0;
            goto LAB_001400ec;
          }
        }
        else {
          plVar22 = xml->child;
          if (plVar22 == (lyxml_elem *)0x0) {
            *(undefined4 *)&(*result)->field_0x34 = 0;
            phVar20 = (hash_table *)lydict_insert(plStack_38,xml->content,0);
            (*result)->ht = phVar20;
          }
          else {
            xml->child = (lyxml_elem *)0x0;
            plVar28 = plVar22;
            do {
              plVar28->parent = (lyxml_elem *)0x0;
              lyxml_correct_elem_ns(plVar30,plVar28,1,1);
              plVar28 = plVar28->next;
            } while (plVar28 != (lyxml_elem *)0x0);
            plVar21 = *result;
            *(undefined4 *)&plVar21->field_0x34 = 8;
            plVar21->ht = (hash_table *)plVar22;
          }
        }
      }
      else {
        iVar9 = xml_get_value(*result,xml,local_74,(uint)local_48 & 0x2000);
        if (iVar9 != 0) goto LAB_001400f3;
      }
LAB_0013ff78:
      plVar21 = *result;
      if ((plVar21->schema->nodetype != LYS_LIST) || (plVar21->schema->padding[2] == '\0')) {
        lyd_hash(plVar21);
        lyd_insert_hash(*result);
        plVar21 = *result;
      }
      iVar9 = lyv_data_context(plVar21,(int)local_48,unres);
      uVar25 = local_48;
      if (iVar9 == 0) {
        if (((char)local_58 == '\0') && (xml->child != (lyxml_elem *)0x0)) {
          first_sibling_local = (lyd_node *)0x0;
          plVar21 = (lyd_node *)0x0;
          plVar22 = xml->child;
          do {
            plVar28 = plVar22->next;
            iVar9 = xml_parse_data(plStack_38,plVar22,*result,(*result)->child,plVar21,(uint)uVar25,
                                   unres,&first_sibling_local,act_notif,yang_data_name);
            if (iVar9 != 0) goto LAB_00140104;
            if (((uint)uVar25 >> 10 & 1) != 0) {
              lyxml_free(plStack_38,plVar22);
            }
            if ((first_sibling_local != (lyd_node *)0x0) &&
               (first_sibling_local->next == (lyd_node *)0x0)) {
              plVar21 = first_sibling_local;
            }
            plVar22 = plVar28;
          } while (plVar28 != (lyxml_elem *)0x0);
        }
        plVar21 = *result;
        if ((((local_50->nodetype == LYS_CONTAINER) && (plVar21->child == (lyd_node *)0x0)) &&
            (plVar21->attr == (lyd_attr *)0x0)) &&
           ((local_50->type).ext == (lys_ext_instance **)0x0)) {
          plVar21->field_0x9 = plVar21->field_0x9 | 1;
          plVar21 = *result;
        }
        iVar9 = lyv_data_content(plVar21,(int)local_48,unres);
        if (iVar9 == 0) {
          first_sibling_00 = &local_88;
          if (dattr == (lyd_attr *)0x0) {
            first_sibling_00 = (lyd_node **)0x0;
          }
          iVar9 = lyv_multicases(*result,(lys_node *)0x0,first_sibling_00,0,(lyd_node *)0x0);
          if (iVar9 == 0) {
            if (((*result)->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) {
              puVar1 = &(*result)->validity;
              *puVar1 = *puVar1 | 1;
              return 0;
            }
            return 0;
          }
        }
      }
      goto LAB_00140104;
    }
  }
  else {
    bVar34 = false;
    do {
      bVar7 = bVar34;
      if (plVar27->type == LYXML_ATTR_STD) {
        if (plVar27->ns == (lyxml_ns *)0x0) {
          if (((*result)->schema->nodetype == LYS_ANYXML) &&
             (iVar9 = ly_strequal_((*result)->schema->name,"filter"), iVar9 != 0)) {
            iVar9 = ly_strequal_((*result)->schema->module->name,"ietf-netconf");
            bVar7 = true;
            if (iVar9 == 0) {
              iVar9 = ly_strequal_((*result)->schema->module->name,"notifications");
              pcVar18 = "urn:ietf:params:xml:ns:netconf:base:1.0";
              if (iVar9 == 0) goto LAB_0013fa52;
            }
            else {
              pcVar18 = "urn:ietf:params:xml:ns:netconf:base:1.0";
            }
            goto LAB_0013f937;
          }
        }
        else {
          pcVar18 = plVar27->ns->value;
LAB_0013f937:
          iVar9 = lyp_fill_attr(plStack_38,*result,pcVar18,(char *)0x0,plVar27->name,plVar27->value,
                                xml,(int)local_48,&stack0xffffffffffffff90);
          bVar34 = bVar7;
          if (iVar9 != 1) {
            if (iVar9 == -1) goto LAB_001400f3;
            if ((bVar7) &&
               (iVar9 = strcmp(plVar27->name,"select"), plVar30 = plStack_38, iVar9 == 0)) {
              pcVar18 = transform_xml2json(plStack_38,plStack_70->value_str,xml,0,0);
              (plStack_70->value).binary = pcVar18;
              if (pcVar18 == (char *)0x0) {
                plStack_70->value = (lyd_val)plStack_70->value_str;
                goto LAB_001400f3;
              }
              lydict_remove(plVar30,plStack_70->value_str);
              plStack_70->value_str = (char *)plStack_70->value;
            }
            plVar5 = (*result)->attr;
            if (plVar5 == (lyd_attr *)0x0) {
              (*result)->attr = plStack_70;
            }
            else {
              do {
                plVar19 = plVar5;
                plVar5 = plVar19->next;
              } while (plVar5 != (lyd_attr *)0x0);
              plVar19->next = plStack_70;
            }
            goto LAB_0013faae;
          }
        }
LAB_0013fa52:
        if (((uint)local_48 >> 9 & 1) != 0) {
          pcVar18 = plVar27->name;
          plVar16 = (lys_node_list *)*result;
          goto LAB_0013fcde;
        }
        pcVar18 = "<none>";
        if (plVar27->ns != (lyxml_ns *)0x0) {
          pcVar18 = plVar27->ns->prefix;
        }
        ly_log(plStack_38,LY_LLWRN,LY_SUCCESS,
               "Unknown \"%s:%s\" metadata with value \"%s\", ignoring.",pcVar18,plVar27->name,
               plVar27->value);
        bVar7 = bVar34;
      }
LAB_0013faae:
      plVar27 = plVar27->next;
      bVar34 = bVar7;
    } while (plVar27 != (lyxml_attr *)0x0);
    if ((local_48 & 8) != 0) goto LAB_0013fc01;
    if (!bVar7) goto switchD_0013fbe8_caseD_1;
    pcVar32 = ((lys_node_list *)*result)->ref;
    if (pcVar32 == (char *)0x0) {
switchD_0013fbe8_default:
      uVar33 = 0x1c0;
LAB_0013fe1d:
      ly_log(plStack_38,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
             ,uVar33);
      goto LAB_001400f3;
    }
    uVar10 = 0;
    local_60 = (lys_node_list *)*result;
    do {
      pcVar18 = *(char **)(pcVar32 + 0x18);
      iVar9 = strcmp(pcVar18,"type");
      if (iVar9 == 0) {
        if ((4 < uVar10) || ((0x16U >> uVar10 & 1) == 0)) {
          if (*(int *)(*(long *)(pcVar32 + 0x28) + 0x1c) == 1) {
            if (uVar10 == 0) {
              uVar8 = 2;
            }
            else {
              uVar8 = 4;
              if (uVar10 != 3) {
                __assert_fail("!found",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                              ,0x195,
                              "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                             );
              }
            }
            goto LAB_0013fbbe;
          }
          if (*(int *)(*(long *)(pcVar32 + 0x28) + 0x1c) == 0) {
            uVar8 = 1;
            if (uVar10 == 0) goto LAB_0013fbbe;
            plVar16 = local_60;
            if (uVar10 != 3) {
              __assert_fail("!found",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                            ,0x18d,
                            "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                           );
            }
LAB_0013fcde:
            ly_vlog(plStack_38,LYE_INATTR,LY_VLOG_LYD,plVar16,pcVar18);
            goto LAB_001400f3;
          }
          uVar33 = 0x19a;
          goto LAB_0013fe1d;
        }
        pcVar18 = xml->name;
        pcVar32 = "type";
        LVar29 = LYE_TOOMANY;
        LVar24 = LY_VLOG_LYD;
        plVar16 = local_60;
        plVar30 = plStack_38;
        goto LAB_001400ec;
      }
      iVar9 = strcmp(pcVar18,"select");
      uVar8 = uVar10;
      if (iVar9 == 0) {
        iVar9 = (*(code *)(&DAT_001a6524 + *(int *)(&DAT_001a6524 + (ulong)uVar10 * 4)))();
        return iVar9;
      }
LAB_0013fbbe:
      uVar10 = uVar8;
      pcVar32 = *(char **)(pcVar32 + 8);
    } while (pcVar32 != (char *)0x0);
    switch(uVar10) {
    case 1:
    case 4:
      goto switchD_0013fbe8_caseD_1;
    case 2:
      pcVar18 = xml->name;
      pcVar32 = "select";
      break;
    case 3:
      pcVar18 = xml->name;
      pcVar32 = "type";
      break;
    default:
      goto switchD_0013fbe8_default;
    }
    LVar29 = LYE_MISSATTR;
    LVar24 = LY_VLOG_LYD;
    plVar16 = local_60;
    plVar30 = plStack_38;
LAB_001400ec:
    ly_vlog(plVar30,LVar29,LVar24,plVar16,pcVar32,pcVar18);
  }
LAB_001400f3:
  lyd_unlink_internal(*result,2);
LAB_00140104:
  uVar10 = unres->count - 1;
  if (-1 < (int)uVar10) {
    uVar25 = (ulong)uVar10;
    do {
      if (unres->node[uVar25] == *result) {
        unres_data_del(unres,(uint32_t)uVar25);
      }
      bVar34 = 0 < (long)uVar25;
      uVar25 = uVar25 - 1;
    } while (bVar34);
  }
  lyd_free(*result);
  *result = (lyd_node *)0x0;
  return -1;
}

Assistant:

static int
xml_parse_data(struct ly_ctx *ctx, struct lyxml_elem *xml, struct lyd_node *parent, struct lyd_node *first_sibling,
               struct lyd_node *prev, int options, struct unres_data *unres, struct lyd_node **result,
               struct lyd_node **act_notif, const char *yang_data_name)
{
    const struct lys_module *mod = NULL;
    struct lyd_node *diter, *dlast;
    struct lys_node *schema = NULL, *target;
    const struct lys_node *ext_node;
    struct lys_node_augment *aug;
    struct lyd_attr *dattr, *dattr_iter;
    struct lyxml_attr *attr;
    struct lyxml_elem *child, *next;
    int i, j, havechildren, r, editbits = 0, filterflag = 0, found;
    uint8_t pos;
    int ret = 0;
    const char *str = NULL;
    char *msg;

    assert(xml);
    assert(result);
    *result = NULL;

    if (xml->flags & LYXML_ELEM_MIXED) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_XML, xml, "XML element with mixed content");
            return -1;
        } else {
            return 0;
        }
    }

    if (!xml->ns || !xml->ns->value) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(ctx, LYE_XML_MISS, LY_VLOG_XML, xml, "element's", "namespace");
            return -1;
        } else {
            return 0;
        }
    }

    /* find schema node */
    if (!parent) {
        mod = ly_ctx_get_module_by_ns(ctx, xml->ns->value, NULL, 0);
        if (ctx->data_clb) {
            if (!mod) {
                mod = ctx->data_clb(ctx, NULL, xml->ns->value, 0, ctx->data_clb_data);
            } else if (!mod->implemented) {
                mod = ctx->data_clb(ctx, mod->name, mod->ns, LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
            }
        }

        /* get the proper schema node */
        if (mod && mod->implemented && !mod->disabled) {
            if (options & LYD_OPT_DATA_TEMPLATE) {
                if (yang_data_name) {
                    ext_node = lyp_get_yang_data_template(mod, yang_data_name, strlen(yang_data_name));
                    if (ext_node) {
                        schema = *((struct lys_node **) lys_ext_complex_get_substmt(LY_STMT_CONTAINER, (struct lys_ext_instance_complex *)ext_node, NULL));
                        schema = xml_data_search_schemanode(xml, schema, options);
                    }
                }
            } else {
                schema = xml_data_search_schemanode(xml, mod->data, options);
                if (!schema) {
                    /* it still can be the specific case of this module containing an augment of another module
                    * top-level choice or top-level choice's case, bleh */
                    for (j = 0; j < mod->augment_size; ++j) {
                        aug = &mod->augment[j];
                        target = aug->target;
                        if (target->nodetype & (LYS_CHOICE | LYS_CASE)) {
                            /* 1) okay, the target is choice or case */
                            while (target && (target->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES))) {
                                target = lys_parent(target);
                            }
                            /* 2) now, the data node will be top-level, there are only non-data schema nodes */
                            if (!target) {
                                while ((schema = (struct lys_node *) lys_getnext(schema, (struct lys_node *) aug, NULL, 0))) {
                                    /* 3) alright, even the name matches, we found our schema node */
                                    if (ly_strequal(schema->name, xml->name, 1)) {
                                        break;
                                    }
                                }
                            }
                        }

                        if (schema) {
                            break;
                        }
                    }
                }
            }
        }
    } else {
        /* parsing some internal node, we start with parent's schema pointer */
        schema = xml_data_search_schemanode(xml, parent->schema->child, options);

        if (ctx->data_clb) {
            if (schema && !lys_node_module(schema)->implemented) {
                ctx->data_clb(ctx, lys_node_module(schema)->name, lys_node_module(schema)->ns,
                              LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
            } else if (!schema) {
                if (ctx->data_clb(ctx, NULL, xml->ns->value, 0, ctx->data_clb_data)) {
                    /* context was updated, so try to find the schema node again */
                    schema = xml_data_search_schemanode(xml, parent->schema->child, options);
                }
            }
        }
    }

    mod = lys_node_module(schema);
    if (!mod || !mod->implemented || mod->disabled) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(ctx, LYE_INELEM, (parent ? LY_VLOG_LYD : LY_VLOG_STR), (parent ? (void *)parent : (void *)"/") , xml->name);
            return -1;
        } else {
            return 0;
        }
    }

    /* create the element structure */
    switch (schema->nodetype) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_NOTIF:
    case LYS_RPC:
    case LYS_ACTION:
        for (i = 0; xml->content && xml->content[i]; ++i) {
            if (!is_xmlws(xml->content[i])) {
                msg = malloc(22 + strlen(xml->content) + 1);
                LY_CHECK_ERR_RETURN(!msg, LOGMEM(ctx), -1);
                sprintf(msg, "node with text data \"%s\"", xml->content);
                LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_XML, xml, msg);
                free(msg);
                return -1;
            }
        }
        *result = calloc(1, sizeof **result);
        havechildren = 1;
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
        *result = calloc(1, sizeof(struct lyd_node_leaf_list));
        havechildren = 0;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        *result = calloc(1, sizeof(struct lyd_node_anydata));
        havechildren = 0;
        break;
    default:
        LOGINT(ctx);
        return -1;
    }
    LY_CHECK_ERR_RETURN(!(*result), LOGMEM(ctx), -1);

    (*result)->prev = *result;
    (*result)->schema = schema;
    (*result)->parent = parent;
    diter = NULL;
    if (schema->nodetype == LYS_LEAF && lys_is_key((struct lys_node_leaf *)schema, &pos)) {
        /* it is key and we need to insert it into a correct place (a key must have a parent list) */
        assert(parent);
        for (i = 0, diter = parent->child;
                diter && i < pos && diter->schema->nodetype == LYS_LEAF && lys_is_key((struct lys_node_leaf *)diter->schema, NULL);
                i++, diter = diter->next);
        if (diter) {
            /* out of order insertion - insert list's key to the correct position, before the diter */
            if (options & LYD_OPT_STRICT) {
                LOGVAL(ctx, LYE_INORDER, LY_VLOG_LYD, *result, schema->name, diter->schema->name);
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Invalid position of the key \"%s\" in a list \"%s\".",
                       schema->name, parent->schema->name);
                free(*result);
                *result = NULL;
                return -1;
            } else {
                LOGWRN(ctx, "Invalid position of the key \"%s\" in a list \"%s\".", schema->name, parent->schema->name)
            }
            if (parent->child == diter) {
                parent->child = *result;
                /* update first_sibling */
                first_sibling = *result;
            }
            if (diter->prev->next) {
                diter->prev->next = *result;
            }
            (*result)->prev = diter->prev;
            diter->prev = *result;
            (*result)->next = diter;
        }
    }
    if (!diter) {
        /* simplified (faster) insert as the last node */
        if (parent && !parent->child) {
            parent->child = *result;
        }
        if (prev) {
            (*result)->prev = prev;
            prev->next = *result;

            /* fix the "last" pointer */
            first_sibling->prev = *result;
        } else {
            (*result)->prev = *result;
            first_sibling = *result;
        }
    }
    (*result)->validity = ly_new_node_validity((*result)->schema);
    if (resolve_applies_when(schema, 0, NULL)) {
        (*result)->when_status = LYD_WHEN;
    }

    /* process attributes */
    for (attr = xml->attr; attr; attr = attr->next) {
        if (attr->type != LYXML_ATTR_STD) {
            continue;
        } else if (!attr->ns) {
            if ((*result)->schema->nodetype == LYS_ANYXML &&
                    ly_strequal((*result)->schema->name, "filter", 0) &&
                    (ly_strequal((*result)->schema->module->name, "ietf-netconf", 0) ||
                    ly_strequal((*result)->schema->module->name, "notifications", 0))) {
                /* NETCONF filter's attributes, which we implement as non-standard annotations,
                 * they are unqualified (no namespace), but we know that we have internally defined
                 * them in the ietf-netconf module */
                str = "urn:ietf:params:xml:ns:netconf:base:1.0";
                filterflag = 1;
            } else {
                /* garbage */
                goto attr_error;
            }
        } else {
            str = attr->ns->value;
        }

        r = lyp_fill_attr(ctx, *result, str, NULL, attr->name, attr->value, xml, options, &dattr);
        if (r == -1) {
            goto unlink_node_error;
        } else if (r == 1) {
attr_error:
            if (options & LYD_OPT_STRICT) {
                LOGVAL(ctx, LYE_INATTR, LY_VLOG_LYD, *result, attr->name);
                goto unlink_node_error;
            }

            LOGWRN(ctx, "Unknown \"%s:%s\" metadata with value \"%s\", ignoring.",
                   (attr->ns ? attr->ns->prefix : "<none>"), attr->name, attr->value);
            continue;
        }

        /* special case of xpath in the value, we want to convert it to JSON */
        if (filterflag && !strcmp(attr->name, "select")) {
            dattr->value.string = transform_xml2json(ctx, dattr->value_str, xml, 0, 0);
            if (!dattr->value.string) {
                /* problem with resolving value as xpath */
                dattr->value.string = dattr->value_str;
                goto unlink_node_error;
            }
            lydict_remove(ctx, dattr->value_str);
            dattr->value_str = dattr->value.string;
        }

        /* insert into the data node */
        if (!(*result)->attr) {
            (*result)->attr = dattr;
        } else {
            for (dattr_iter = (*result)->attr; dattr_iter->next; dattr_iter = dattr_iter->next);
            dattr_iter->next = dattr;
        }
        continue;
    }

    /* check insert attribute and its values */
    if (options & LYD_OPT_EDIT) {
        if (lyp_check_edit_attr(ctx, (*result)->attr, *result, &editbits)) {
            goto unlink_node_error;
        }

    /* check correct filter extension attributes */
    } else if (filterflag) {
        found = 0; /* 0 - nothing, 1 - type subtree, 2 - type xpath, 3 - select, 4 - type xpath + select */
        LY_TREE_FOR((*result)->attr, dattr_iter) {
            if (!strcmp(dattr_iter->name, "type")) {
                if ((found == 1) || (found == 2) || (found == 4)) {
                    LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYD, (*result), "type", xml->name);
                    goto unlink_node_error;
                }
                switch (dattr_iter->value.enm->value) {
                case 0:
                    /* subtree */
                    if (found == 3) {
                        LOGVAL(ctx, LYE_INATTR, LY_VLOG_LYD, (*result), dattr_iter->name);
                        goto unlink_node_error;
                    }

                    assert(!found);
                    found = 1;
                    break;
                case 1:
                    /* xpath */
                    if (found == 3) {
                        found = 4;
                    } else {
                        assert(!found);
                        found = 2;
                    }
                    break;
                default:
                    LOGINT(ctx);
                    goto unlink_node_error;
                }
            } else if (!strcmp(dattr_iter->name, "select")) {
                switch (found) {
                case 0:
                    found = 3;
                    break;
                case 1:
                    LOGVAL(ctx, LYE_INATTR, LY_VLOG_LYD, (*result), dattr_iter->name);
                    goto unlink_node_error;
                case 2:
                    found = 4;
                    break;
                case 3:
                case 4:
                    LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYD, (*result), "select", xml->name);
                    goto unlink_node_error;
                default:
                    LOGINT(ctx);
                    goto unlink_node_error;
                }
            }
        }

        /* check if what we found is correct */
        switch (found) {
        case 1:
        case 4:
            /* ok */
            break;
        case 2:
            LOGVAL(ctx, LYE_MISSATTR, LY_VLOG_LYD, (*result), "select", xml->name);
            goto unlink_node_error;
        case 3:
            LOGVAL(ctx, LYE_MISSATTR, LY_VLOG_LYD, (*result), "type", xml->name);
            goto unlink_node_error;
        default:
            LOGINT(ctx);
            goto unlink_node_error;
        }
    }

    /* type specific processing */
    if (schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
        /* type detection and assigning the value */
        if (xml_get_value(*result, xml, editbits, options & LYD_OPT_TRUSTED)) {
            goto unlink_node_error;
        }
    } else if (schema->nodetype & LYS_ANYDATA) {
        /* store children values */
        if (xml->child) {
            child = xml->child;
            /* manually unlink all siblings and correct namespaces */
            xml->child = NULL;
            LY_TREE_FOR(child, next) {
                next->parent = NULL;
                lyxml_correct_elem_ns(ctx, next, 1, 1);
            }

            ((struct lyd_node_anydata *)*result)->value_type = LYD_ANYDATA_XML;
            ((struct lyd_node_anydata *)*result)->value.xml = child;
        } else {
            ((struct lyd_node_anydata *)*result)->value_type = LYD_ANYDATA_CONSTSTRING;
            ((struct lyd_node_anydata *)*result)->value.str = lydict_insert(ctx, xml->content, 0);
        }
    } else if (schema->nodetype & (LYS_RPC | LYS_ACTION)) {
        if (!(options & LYD_OPT_RPC) || *act_notif) {
            LOGVAL(ctx, LYE_INELEM, LY_VLOG_LYD, (*result), schema->name);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Unexpected %s node \"%s\".",
                   (schema->nodetype == LYS_RPC ? "rpc" : "action"), schema->name);
            goto unlink_node_error;
        }
        *act_notif = *result;
    } else if (schema->nodetype == LYS_NOTIF) {
        if (!(options & LYD_OPT_NOTIF) || *act_notif) {
            LOGVAL(ctx, LYE_INELEM, LY_VLOG_LYD, (*result), schema->name);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Unexpected notification node \"%s\".", schema->name);
            goto unlink_node_error;
        }
        *act_notif = *result;
    }

#ifdef LY_ENABLED_CACHE
    /* calculate the hash and insert it into parent (list with keys is handled when its keys are inserted) */
    if (((*result)->schema->nodetype != LYS_LIST) || !((struct lys_node_list *)(*result)->schema)->keys_size) {
        lyd_hash(*result);
        lyd_insert_hash(*result);
    }
#endif

    /* first part of validation checks */
    if (lyv_data_context(*result, options, unres)) {
        goto error;
    }

    /* process children */
    if (havechildren && xml->child) {
        diter = dlast = NULL;
        LY_TREE_FOR_SAFE(xml->child, next, child) {
            r = xml_parse_data(ctx, child, *result, (*result)->child, dlast, options, unres, &diter, act_notif, yang_data_name);
            if (r) {
                goto error;
            } else if (options & LYD_OPT_DESTRUCT) {
                lyxml_free(ctx, child);
            }
            if (diter && !diter->next) {
                /* the child was parsed/created and it was placed as the last child. The child can be inserted
                 * out of order (not as the last one) in case it is a list's key present out of the correct order */
                dlast = diter;
            }
        }
    }

    /* if we have empty non-presence container, we keep it, but mark it as default */
    if (schema->nodetype == LYS_CONTAINER && !(*result)->child &&
            !(*result)->attr && !((struct lys_node_container *)schema)->presence) {
        (*result)->dflt = 1;
    }

    /* rest of validation checks */
    if (lyv_data_content(*result, options, unres) ||
            lyv_multicases(*result, NULL, prev ? &first_sibling : NULL, 0, NULL)) {
        goto error;
    }

    /* validation successful */
    if ((*result)->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) {
        /* postpone checking when there will be all list/leaflist instances */
        (*result)->validity |= LYD_VAL_DUP;
    }

    return ret;

unlink_node_error:
    lyd_unlink_internal(*result, 2);
error:
    /* cleanup */
    for (i = unres->count - 1; i >= 0; i--) {
        /* remove unres items connected with the node being removed */
        if (unres->node[i] == *result) {
            unres_data_del(unres, i);
        }
    }
    lyd_free(*result);
    *result = NULL;
    return -1;
}